

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessRTCPCompoundPacket
          (RTPSources *this,RTCPCompoundPacket *rtcpcomppack,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  RTPInternalSourceData *pRVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  int iVar9;
  _Self __tmp;
  long lVar10;
  int32_t iVar11;
  void *pvVar12;
  size_t sVar13;
  long lVar14;
  uint8_t uVar15;
  uint uVar16;
  ItemType t;
  ulong uVar17;
  ulong uVar18;
  uint32_t uVar19;
  uint uVar20;
  uint32_t uVar21;
  size_t valuelen;
  uint32_t uVar22;
  void *valuedata;
  uint32_t uVar23;
  uint32_t uVar24;
  RTCPBYEPacket *p;
  _List_node_base *p_Var25;
  bool bVar26;
  bool bVar27;
  int local_7c;
  uint local_64;
  RTPNTPTime local_38;
  
  pRVar6 = this->owndata;
  if (pRVar6 == (RTPInternalSourceData *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = (pRVar6->super_RTPSourceData).ssrc;
  }
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[3])
            (this,rtcpcomppack,receivetime,senderaddress);
  (rtcpcomppack->rtcppackit)._M_node =
       (rtcpcomppack->rtcppacklist).
       super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
LAB_0011d610:
  do {
    p_Var7 = (rtcpcomppack->rtcppackit)._M_node;
    if (p_Var7 == (_List_node_base *)&rtcpcomppack->rtcppacklist) {
      p_Var25 = (_List_node_base *)0x0;
    }
    else {
      p_Var25 = p_Var7[1]._M_next;
      (rtcpcomppack->rtcppackit)._M_node = p_Var7->_M_next;
    }
    if (p_Var25 == (_List_node_base *)0x0) {
      return 0;
    }
    lVar10 = 0x88;
    if (*(char *)&p_Var25[1]._M_prev != '\x01') break;
    lVar10 = 0x78;
    switch(*(undefined4 *)((long)&p_Var25[1]._M_prev + 4)) {
    case 0:
      p_Var7 = p_Var25->_M_prev;
      uVar20 = *(uint *)((long)&p_Var7->_M_next + 4);
      uVar19 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      uVar20 = *(uint *)((long)&p_Var7->_M_prev + 4);
      uVar17 = (ulong)*(uint *)&p_Var7->_M_prev << 0x20;
      local_38 = (RTPNTPTime)
                 (uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                  (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                  ((ulong)uVar20 & 0xff000000) << 8 | ((ulong)uVar20 & 0xff0000) << 0x18 |
                  ((ulong)uVar20 & 0xff00) << 0x28 |
                 CONCAT44(*(uint *)&p_Var7->_M_prev,uVar20) << 0x38);
      p_Var7 = p_Var25->_M_prev;
      uVar20 = *(uint *)&p_Var7[1]._M_next;
      uVar16 = *(uint *)((long)&p_Var7[1]._M_next + 4);
      uVar5 = *(uint *)&p_Var7[1]._M_prev;
      iVar9 = ProcessRTCPSenderInfo
                        (this,uVar19,&local_38,
                         uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18,
                         uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                         uVar16 << 0x18,
                         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18,receivetime,senderaddress);
      if (-1 < iVar9) {
        bVar26 = false;
        uVar20 = 0;
        if (pRVar6 != (RTPInternalSourceData *)0x0) {
          if (*(char *)&p_Var25[1]._M_prev == '\x01') {
            uVar20 = *(byte *)&p_Var25->_M_prev->_M_next & 0x1f;
          }
          bVar27 = uVar20 != 0;
          if (uVar20 == 0) {
            bVar26 = false;
            iVar9 = local_7c;
          }
          else {
            uVar17 = 1;
            lVar10 = 0;
            bVar26 = false;
            do {
              cVar2 = *(char *)&p_Var25[1]._M_prev;
              uVar16 = 0;
              if (cVar2 == '\x01') {
                uVar16 = *(uint *)((long)&p_Var25->_M_prev[1]._M_prev + lVar10 + 4);
                uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                         uVar16 << 0x18;
              }
              if (uVar16 == local_64) {
                uVar15 = '\0';
                iVar11 = 0;
                if (cVar2 != '\0') {
                  uVar15 = *(uint8_t *)((long)&p_Var25->_M_prev[2]._M_next + lVar10);
                  uVar4 = *(ushort *)((long)&p_Var25->_M_prev[2]._M_next + lVar10 + 2);
                  uVar16 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
                  bVar1 = *(byte *)((long)&p_Var25->_M_prev[2]._M_next + lVar10 + 1);
                  iVar9 = (uint)bVar1 * 0x10000;
                  iVar11 = iVar9 + uVar16 + -0x1000000;
                  if (-1 < (char)bVar1) {
                    iVar11 = uVar16 + iVar9;
                  }
                }
                uVar22 = 0;
                uVar21 = 0;
                if (cVar2 != '\0') {
                  uVar16 = *(uint *)((long)&p_Var25->_M_prev[2]._M_next + lVar10 + 4);
                  uVar21 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                           uVar16 << 0x18;
                  uVar16 = *(uint *)((long)&p_Var25->_M_prev[2]._M_prev + lVar10);
                  uVar22 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                           uVar16 << 0x18;
                }
                uVar24 = 0;
                uVar23 = 0;
                if (cVar2 != '\0') {
                  uVar16 = *(uint *)((long)&p_Var25->_M_prev[2]._M_prev + lVar10 + 4);
                  uVar23 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                           uVar16 << 0x18;
                  uVar16 = *(uint *)((long)&p_Var25->_M_prev[3]._M_next + lVar10);
                  uVar24 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                           uVar16 << 0x18;
                }
                iVar9 = ProcessRTCPReportBlock
                                  (this,uVar19,uVar15,iVar11,uVar21,uVar22,uVar23,uVar24,receivetime
                                   ,senderaddress);
                bVar26 = true;
                if (iVar9 < 0) break;
              }
              bVar27 = uVar17 < uVar20;
              lVar10 = lVar10 + 0x18;
              uVar17 = uVar17 + 1;
              iVar9 = local_7c;
            } while ((ulong)(uVar20 << 3) * 3 != lVar10);
          }
          local_7c = iVar9;
          if (bVar27) goto LAB_0011de66;
        }
        if (bVar26) goto LAB_0011de85;
LAB_0011de76:
        iVar9 = UpdateReceiveTime(this,uVar19,receivetime,senderaddress);
        if (-1 < iVar9) goto LAB_0011de85;
      }
      bVar26 = false;
      local_7c = iVar9;
      break;
    case 1:
      uVar20 = *(uint *)((long)&p_Var25->_M_prev->_M_next + 4);
      uVar19 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      if (pRVar6 == (RTPInternalSourceData *)0x0) {
        bVar26 = false;
LAB_0011de44:
        if (!bVar26) goto LAB_0011de76;
        goto LAB_0011de85;
      }
      bVar1 = *(byte *)&p_Var25->_M_prev->_M_next;
      uVar20 = bVar1 & 0x1f;
      bVar26 = (bVar1 & 0x1f) == 0;
      bVar27 = !bVar26;
      if (bVar26) {
        bVar26 = false;
        iVar9 = local_7c;
      }
      else {
        uVar17 = 1;
        lVar10 = 0;
        bVar26 = false;
        do {
          cVar2 = *(char *)&p_Var25[1]._M_prev;
          uVar16 = 0;
          if (cVar2 == '\x01') {
            uVar16 = *(uint *)((long)&p_Var25->_M_prev->_M_prev + lVar10);
            uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                     uVar16 << 0x18;
          }
          if (uVar16 == local_64) {
            uVar15 = '\0';
            iVar11 = 0;
            if (cVar2 != '\0') {
              uVar15 = *(uint8_t *)((long)&p_Var25->_M_prev->_M_prev + lVar10 + 4);
              uVar4 = *(ushort *)((long)&p_Var25->_M_prev->_M_prev + lVar10 + 6);
              uVar16 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
              bVar1 = *(byte *)((long)&p_Var25->_M_prev->_M_prev + lVar10 + 5);
              iVar9 = (uint)bVar1 * 0x10000;
              iVar11 = iVar9 + uVar16 + -0x1000000;
              if (-1 < (char)bVar1) {
                iVar11 = uVar16 + iVar9;
              }
            }
            uVar22 = 0;
            uVar21 = 0;
            if (cVar2 != '\0') {
              uVar16 = *(uint *)((long)&p_Var25->_M_prev[1]._M_next + lVar10);
              uVar21 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                       uVar16 << 0x18;
              uVar16 = *(uint *)((long)&p_Var25->_M_prev[1]._M_next + lVar10 + 4);
              uVar22 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                       uVar16 << 0x18;
            }
            uVar24 = 0;
            uVar23 = 0;
            if (cVar2 != '\0') {
              uVar16 = *(uint *)((long)&p_Var25->_M_prev[1]._M_prev + lVar10);
              uVar23 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                       uVar16 << 0x18;
              uVar16 = *(uint *)((long)&p_Var25->_M_prev[1]._M_prev + lVar10 + 4);
              uVar24 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                       uVar16 << 0x18;
            }
            iVar9 = ProcessRTCPReportBlock
                              (this,uVar19,uVar15,iVar11,uVar21,uVar22,uVar23,uVar24,receivetime,
                               senderaddress);
            bVar26 = true;
            if (iVar9 < 0) break;
          }
          bVar27 = uVar17 < uVar20;
          lVar10 = lVar10 + 0x18;
          uVar17 = uVar17 + 1;
          iVar9 = local_7c;
        } while ((ulong)(uVar20 << 3) * 3 != lVar10);
      }
      local_7c = iVar9;
      if (!bVar27) goto LAB_0011de44;
LAB_0011de66:
      bVar26 = false;
      break;
    case 2:
      p_Var7 = p_Var25->_M_prev->_M_next;
      if (((ulong)p_Var7 & 0x1f) == 0) {
        p_Var25[2]._M_next = (_List_node_base *)0x0;
      }
      else {
        p_Var25[2]._M_next = (_List_node_base *)((long)&p_Var25->_M_prev->_M_next + 4);
        *(undefined4 *)&p_Var25[2]._M_prev = 1;
        p_Var25[3]._M_next = (_List_node_base *)0x4;
      }
      if (((ulong)p_Var7 & 0x1f) != 0) {
        do {
          uVar19 = 0;
          if ((*(char *)&p_Var25[1]._M_prev == '\x01') &&
             (p_Var25[2]._M_next != (_List_node_base *)0x0)) {
            uVar20 = *(uint *)&(p_Var25[2]._M_next)->_M_next;
            uVar19 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18;
          }
          if ((*(char *)&p_Var25[1]._M_prev == '\0') ||
             (p_Var25[2]._M_next == (_List_node_base *)0x0)) {
            bVar26 = false;
          }
          else {
            p_Var25[3]._M_next = (_List_node_base *)0x4;
            bVar26 = *(char *)((long)&(p_Var25[2]._M_next)->_M_next + 4) != '\0';
          }
          if (bVar26) {
            do {
              cVar2 = *(char *)&p_Var25[1]._M_prev;
              bVar27 = false;
              t = None;
              if (cVar2 == '\x01') {
                if (p_Var25[2]._M_next == (_List_node_base *)0x0) {
                  bVar27 = false;
                  t = None;
                }
                else {
                  bVar1 = *(byte *)((long)&(p_Var25[2]._M_next)->_M_next + (long)p_Var25[3]._M_next)
                  ;
                  t = (ItemType)bVar1;
                  switch(bVar1) {
                  case 0:
                    break;
                  case 1:
                    t = CNAME;
                    break;
                  case 2:
                    t = NAME;
                    break;
                  case 3:
                    t = EMAIL;
                    break;
                  case 4:
                    t = PHONE;
                    break;
                  case 5:
                    t = LOC;
                    break;
                  case 6:
                    t = TOOL;
                    break;
                  case 7:
                    t = NOTE;
                    break;
                  case 8:
                    t = PRIV;
                    bVar27 = true;
                    goto LAB_0011db6b;
                  default:
                    t = Unknown;
                  }
                  bVar27 = false;
                }
              }
LAB_0011db6b:
              if (bVar27) {
                if (((cVar2 == '\0') ||
                    (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                   ((p_Var8 = p_Var25[3]._M_next,
                    *(char *)((long)&p_Var7->_M_next + (long)p_Var8) != '\b' ||
                    ((bVar1 = ((undefined1 *)((long)&p_Var7->_M_next + 1))[(long)p_Var8], bVar1 == 0
                     || (bVar3 = ((undefined1 *)((long)&p_Var7->_M_next + 2))[(long)p_Var8],
                        sVar13 = (size_t)bVar3, bVar1 - 1 < (uint)bVar3)))))) {
                  sVar13 = 0;
                }
                if (((cVar2 == '\0') ||
                    (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                   (*(char *)((long)&p_Var7->_M_next + (long)p_Var25[3]._M_next) != '\b')) {
LAB_0011dc10:
                  pvVar12 = (void *)0x0;
                }
                else {
                  lVar10 = (long)&p_Var7->_M_next + (long)p_Var25[3]._M_next;
                  if (*(byte *)(lVar10 + 1) == 0) goto LAB_0011dc10;
                  if (*(byte *)(lVar10 + 1) - 1 < (uint)*(byte *)(lVar10 + 2)) {
                    pvVar12 = (void *)0x0;
                  }
                  else {
                    pvVar12 = (void *)(lVar10 + 3);
                  }
                  if (*(byte *)(lVar10 + 2) == 0) {
                    pvVar12 = (void *)0x0;
                  }
                }
                if (((cVar2 == '\0') ||
                    (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                   (p_Var8 = p_Var25[3]._M_next,
                   *(char *)((long)&p_Var7->_M_next + (long)p_Var8) != '\b')) {
LAB_0011dc5c:
                  valuelen = 0;
                }
                else {
                  bVar1 = ((undefined1 *)((long)&p_Var7->_M_next + 1))[(long)p_Var8];
                  if ((ulong)bVar1 == 0) goto LAB_0011dc5c;
                  bVar3 = ((undefined1 *)((long)&p_Var7->_M_next + 2))[(long)p_Var8];
                  valuelen = 0;
                  if ((uint)bVar3 <= bVar1 - 1) {
                    valuelen = ~(ulong)bVar3 + (ulong)bVar1;
                  }
                }
                if (((cVar2 == '\0') ||
                    (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                   (*(char *)((long)&p_Var7->_M_next + (long)p_Var25[3]._M_next) != '\b')) {
LAB_0011dc98:
                  valuedata = (void *)0x0;
                }
                else {
                  lVar10 = (long)&p_Var7->_M_next + (long)p_Var25[3]._M_next;
                  bVar1 = *(byte *)(lVar10 + 1);
                  if (((ulong)bVar1 == 0) ||
                     (bVar3 = *(byte *)(lVar10 + 2), bVar1 - 1 < (uint)bVar3)) goto LAB_0011dc98;
                  valuedata = (void *)0x0;
                  if ((ulong)bVar1 - 1 != (ulong)bVar3) {
                    valuedata = (void *)(lVar10 + 3 + (ulong)bVar3);
                  }
                }
                iVar9 = ProcessSDESPrivateItem
                                  (this,uVar19,sVar13,pvVar12,valuelen,valuedata,receivetime,
                                   senderaddress);
              }
              else {
                if (((cVar2 == '\0') ||
                    (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                   (*(char *)((long)&p_Var7->_M_next + (long)p_Var25[3]._M_next) == '\0')) {
                  sVar13 = 0;
                }
                else {
                  sVar13 = (size_t)(byte)((undefined1 *)((long)&p_Var7->_M_next + 1))
                                         [(long)p_Var25[3]._M_next];
                }
                if (((cVar2 == '\0') ||
                    (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                   (*(char *)((long)&p_Var7->_M_next + (long)p_Var25[3]._M_next) == '\0')) {
                  pvVar12 = (void *)0x0;
                }
                else {
                  pvVar12 = (void *)((long)&p_Var7->_M_next + (long)p_Var25[3]._M_next + 2);
                }
                iVar9 = ProcessSDESNormalItem
                                  (this,uVar19,t,sVar13,pvVar12,receivetime,senderaddress);
              }
              if (iVar9 < 0) {
                bVar26 = false;
                local_7c = iVar9;
                goto LAB_0011dd82;
              }
              if ((((*(char *)&p_Var25[1]._M_prev != '\x01') ||
                   (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
                  (p_Var8 = p_Var25[3]._M_next,
                  *(char *)((long)&p_Var7->_M_next + (long)p_Var8) == '\0')) ||
                 (uVar17 = (ulong)(byte)((undefined1 *)((long)&p_Var7->_M_next + 1))[(long)p_Var8],
                 *(char *)((long)&p_Var7->_M_next + (long)&p_Var8->_M_next + uVar17 + 2) == '\0'))
              break;
              p_Var25[3]._M_next = (_List_node_base *)((long)&p_Var8->_M_next + uVar17 + 2);
            } while( true );
          }
          if ((bVar26) ||
             (iVar9 = UpdateReceiveTime(this,uVar19,receivetime,senderaddress), -1 < iVar9)) {
            bVar26 = true;
          }
          else {
            bVar26 = false;
            local_7c = iVar9;
          }
LAB_0011dd82:
          if (((!bVar26) || (*(char *)&p_Var25[1]._M_prev != '\x01')) ||
             ((p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0 ||
              (*(uint *)&p_Var25[2]._M_prev == (*(byte *)&p_Var25->_M_prev->_M_next & 0x1f)))))
          goto LAB_0011de8f;
          if (*(char *)((long)&p_Var7->_M_next + 4) == '\0') {
            lVar10 = 4;
          }
          else {
            lVar10 = 4;
            do {
              uVar17 = (ulong)*(byte *)((long)&p_Var7->_M_next + lVar10 + 1);
              lVar14 = lVar10 + uVar17;
              lVar10 = lVar10 + uVar17 + 2;
            } while (*(char *)((long)&p_Var7->_M_next + lVar14 + 2) != '\0');
          }
          uVar17 = (ulong)((uint)(lVar10 + 1) & 3);
          lVar14 = (lVar10 - uVar17) + 5;
          if (uVar17 == 0) {
            lVar14 = lVar10 + 1;
          }
          p_Var25[2]._M_next = (_List_node_base *)((long)&p_Var7->_M_next + lVar14);
          *(uint *)&p_Var25[2]._M_prev = *(uint *)&p_Var25[2]._M_prev + 1;
          p_Var25[3]._M_next = (_List_node_base *)0x4;
        } while( true );
      }
LAB_0011de85:
      bVar26 = true;
      break;
    case 3:
      goto switchD_0011d665_caseD_3;
    case 4:
      goto switchD_0011d665_caseD_4;
    default:
      lVar10 = 0x80;
      goto switchD_0011d665_caseD_4;
    }
LAB_0011de8f:
    if (!bVar26) {
      return local_7c;
    }
  } while( true );
switchD_0011d665_caseD_4:
  (**(code **)((long)(this->super_RTPMemoryObject)._vptr_RTPMemoryObject + lVar10))
            (this,p_Var25,receivetime,senderaddress);
  goto LAB_0011d610;
switchD_0011d665_caseD_3:
  bVar1 = *(byte *)&p_Var25->_M_prev->_M_next;
  uVar17 = (ulong)(bVar1 & 0x1f);
  bVar26 = (bVar1 & 0x1f) != 0;
  iVar9 = local_7c;
  if (bVar26) {
    uVar18 = 1;
    do {
      cVar2 = *(char *)&p_Var25[1]._M_prev;
      uVar19 = 0;
      if (cVar2 == '\x01') {
        uVar20 = *(uint *)((long)&p_Var25->_M_prev->_M_next + uVar18 * 4);
        uVar19 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18
        ;
      }
      if ((cVar2 == '\0') || (p_Var25[2]._M_next == (_List_node_base *)0x0)) {
        sVar13 = 0;
      }
      else {
        sVar13 = (size_t)*(byte *)((long)&p_Var25->_M_prev->_M_next + (long)p_Var25[2]._M_next);
      }
      if (((cVar2 == '\0') || (p_Var7 = p_Var25[2]._M_next, p_Var7 == (_List_node_base *)0x0)) ||
         (*(char *)((long)&p_Var25->_M_prev->_M_next + (long)p_Var7) == '\0')) {
        pvVar12 = (void *)0x0;
      }
      else {
        pvVar12 = (void *)((long)&p_Var25->_M_prev->_M_next + (long)((long)&p_Var7->_M_next + 1));
      }
      iVar9 = ProcessBYE(this,uVar19,sVar13,pvVar12,receivetime,senderaddress);
      if (iVar9 < 0) break;
      bVar26 = uVar18 < uVar17;
      bVar27 = uVar18 != uVar17;
      uVar18 = uVar18 + 1;
      iVar9 = local_7c;
    } while (bVar27);
  }
  local_7c = iVar9;
  if (bVar26) {
    return local_7c;
  }
  goto LAB_0011d610;
}

Assistant:

int RTPSources::ProcessRTCPCompoundPacket(RTCPCompoundPacket *rtcpcomppack,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTCPPacket *rtcppack;
	int status;
	bool gotownssrc = ((owndata == 0)?false:true);
	uint32_t ownssrc = ((owndata != 0)?owndata->GetSSRC():0);
	
	OnRTCPCompoundPacket(rtcpcomppack,receivetime,senderaddress);
	
	rtcpcomppack->GotoFirstPacket();	
	while ((rtcppack = rtcpcomppack->GetNextPacket()) != 0)
	{
		if (rtcppack->IsKnownFormat())
		{
			switch (rtcppack->GetPacketType())
			{
			case RTCPPacket::SR:
				{
					RTCPSRPacket *p = (RTCPSRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					status = ProcessRTCPSenderInfo(senderssrc,p->GetNTPTimestamp(),p->GetRTPTimestamp(),
						                       p->GetSenderPacketCount(),p->GetSenderOctetCount(),
								       receivetime,senderaddress);
					if (status < 0)
						return status;
					
					bool gotinfo = false;
					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc) // data is meant for us
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::RR:
				{
					RTCPRRPacket *p = (RTCPRRPacket *)rtcppack;
					uint32_t senderssrc = p->GetSenderSSRC();
					
					bool gotinfo = false;

					if (gotownssrc)
					{
						int i;
						int num = p->GetReceptionReportCount();
						for (i = 0 ; i < num ; i++)
						{
							if (p->GetSSRC(i) == ownssrc)
							{
								gotinfo = true;
								status = ProcessRTCPReportBlock(senderssrc,p->GetFractionLost(i),p->GetLostPacketCount(i),
										                        p->GetExtendedHighestSequenceNumber(i),p->GetJitter(i),p->GetLSR(i),
													p->GetDLSR(i),receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						}
					}
					if (!gotinfo)
					{
						status = UpdateReceiveTime(senderssrc,receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::SDES:
				{
					RTCPSDESPacket *p = (RTCPSDESPacket *)rtcppack;
					
					if (p->GotoFirstChunk())
					{
						do
						{
							uint32_t sdesssrc = p->GetChunkSSRC();
							bool updated = false;
							if (p->GotoFirstItem())
							{
								do
								{
									RTCPSDESPacket::ItemType t;
				
									if ((t = p->GetItemType()) != RTCPSDESPacket::PRIV)
									{
										updated = true;
										status = ProcessSDESNormalItem(sdesssrc,t,p->GetItemLength(),p->GetItemData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#ifdef RTP_SUPPORT_SDESPRIV
									else
									{
										updated = true;
										status = ProcessSDESPrivateItem(sdesssrc,p->GetPRIVPrefixLength(),p->GetPRIVPrefixData(),p->GetPRIVValueLength(),
												                        p->GetPRIVValueData(),receivetime,senderaddress);
										if (status < 0)
											return status;
									}
#endif // RTP_SUPPORT_SDESPRIV
								} while (p->GotoNextItem());
							}
							if (!updated)
							{
								status = UpdateReceiveTime(sdesssrc,receivetime,senderaddress);
								if (status < 0)
									return status;
							}
						} while (p->GotoNextChunk());
					}
				}
				break;
			case RTCPPacket::BYE:
				{
					RTCPBYEPacket *p = (RTCPBYEPacket *)rtcppack;
					int i;
					int num = p->GetSSRCCount();

					for (i = 0 ; i < num ; i++)
					{
						uint32_t byessrc = p->GetSSRC(i);
						status = ProcessBYE(byessrc,p->GetReasonLength(),p->GetReasonData(),receivetime,senderaddress);
						if (status < 0)
							return status;
					}
				}
				break;
			case RTCPPacket::APP:
				{
					RTCPAPPPacket *p = (RTCPAPPPacket *)rtcppack;

					OnAPPPacket(p,receivetime,senderaddress);
				}
				break; 
			case RTCPPacket::Unknown:
			default:
				{
					OnUnknownPacketType(rtcppack,receivetime,senderaddress);
				}
				break;
			}
		}
		else
		{
			OnUnknownPacketFormat(rtcppack,receivetime,senderaddress);
		}
	}

	return 0;
}